

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_snd_env.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_snd_env::save(xr_level_snd_env *this,xr_writer *w)

{
  xr_writer::open_chunk(w,0);
  xr_writer::
  w_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_writer::f_w_sz>
            (w,&this->m_env_ids);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  xr_cform::save(&this->super_xr_cform,w);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_snd_env::save(xr_writer& w) const
{
	w.open_chunk(FSL_SND_ENV_IDS);
	w.w_seq(m_env_ids, xr_writer::f_w_sz());
	w.close_chunk();

	w.open_chunk(FSL_SND_ENV_GEOMETRY);
	xr_cform::save(w);
	w.close_chunk();
}